

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

string * __thiscall
VectorInstance::op_eraseFromIndex_toIndex
          (string *__return_storage_ptr__,VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  string *value;
  pointer psVar1;
  int iVar2;
  undefined8 *puVar3;
  uint uVar4;
  char *pcVar5;
  long lVar6;
  IntegerInstance IStack_88;
  
  value = (arguments->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)value == 0x40) {
    IntegerInstance::IntegerInstance(&IStack_88,value);
    iVar2 = IStack_88._value;
    lVar6 = (long)IStack_88._value;
    CharacterInstance::~CharacterInstance((CharacterInstance *)&IStack_88);
    IntegerInstance::IntegerInstance
              (&IStack_88,
               (arguments->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1);
    CharacterInstance::~CharacterInstance((CharacterInstance *)&IStack_88);
    if (-1 < lVar6) {
      psVar1 = (this->_value).
               super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = (uint)((ulong)((long)(this->_value).
                                   super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1) >> 4);
      if ((((iVar2 <= (int)uVar4) && (-1 < IStack_88._value)) && ((uint)IStack_88._value <= uVar4))
         && ((uint)iVar2 <= (uint)IStack_88._value)) {
        std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::
        _M_erase(&this->_value,psVar1 + lVar6,psVar1 + (uint)IStack_88._value);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"null","");
        return __return_storage_ptr__;
      }
    }
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar5 = "RuntimeError: invalid argument.";
  }
  else {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar5 = "RuntimeError: wrong number of arguments.";
  }
  *puVar3 = pcVar5;
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

std::string VectorInstance::op_eraseFromIndex_toIndex(const std::vector<std::string>& arguments) {
    if (arguments.size() != 2)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    int from_index = IntegerInstance(arguments[0]).value();
    int to_index = IntegerInstance(arguments[1]).value();
    if (from_index < 0 || from_index > int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    if (to_index < 0 || to_index > int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    if (to_index - from_index < 0)
        throw EXC_INVALID_ARGUMENT;
    _value.erase(_value.begin() + from_index, _value.begin() + to_index);
    return "null";
}